

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_query_result.cpp
# Opt level: O0

unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
__thiscall duckdb::StreamQueryResult::LockContext(StreamQueryResult *this)

{
  bool bVar1;
  string *msg;
  BaseQueryResult *in_RSI;
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_> in_RDI;
  string error_str;
  ClientContext *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  bVar1 = duckdb::shared_ptr::operator_cast_to_bool
                    ((shared_ptr<duckdb::ClientContext,_true> *)0x8a237d);
  if (bVar1) {
    shared_ptr<duckdb::ClientContext,_true>::operator->
              ((shared_ptr<duckdb::ClientContext,_true> *)in_stack_ffffffffffffff20);
    ClientContext::LockContext(in_stack_ffffffffffffff18);
    return (unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>)
           (__uniq_ptr_impl<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ClientContextLock_*,_std::default_delete<duckdb::ClientContextLock>_>
             .super__Head_base<0UL,_duckdb::ClientContextLock_*,_false>._M_head_impl;
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_30,"Attempting to execute an unsuccessful or closed pending query result",
             &local_31);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  bVar1 = BaseQueryResult::HasError(in_RSI);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff78,"\nError: %s",
               (allocator *)&stack0xffffffffffffff77);
    in_stack_ffffffffffffff20 = BaseQueryResult::GetError_abi_cxx11_((BaseQueryResult *)0x8a2403);
    ::std::__cxx11::string::string(local_b0,(string *)in_stack_ffffffffffffff20);
    StringUtil::Format<std::__cxx11::string>(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    ::std::__cxx11::string::operator+=(local_30,local_68);
    ::std::__cxx11::string::~string(local_68);
    ::std::__cxx11::string::~string(local_b0);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  }
  msg = (string *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException
            ((InvalidInputException *)in_stack_ffffffffffffff20,msg);
  __cxa_throw(msg,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
}

Assistant:

unique_ptr<ClientContextLock> StreamQueryResult::LockContext() {
	if (!context) {
		string error_str = "Attempting to execute an unsuccessful or closed pending query result";
		if (HasError()) {
			error_str += StringUtil::Format("\nError: %s", GetError());
		}
		throw InvalidInputException(error_str);
	}
	return context->LockContext();
}